

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicAtomicCase1CS::Run(BasicAtomicCase1CS *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint location;
  void *pvVar3;
  uint local_a4;
  GLint i_2;
  GLint *data_2;
  GLuint i_1;
  GLuint *data_1;
  GLuint unif [8];
  int data [4];
  GLuint i;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  BasicAtomicCase1CS *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 4) in;\nlayout(std430, binding = 2) coherent buffer FSuint {\n  uint data[4];\n} g_uint_fs;\nlayout(std430, binding = 3) coherent buffer FSint {\n  int data[4];\n} g_int_fs;\nuniform uint g_uint_value[8];\nvoid main() {\n  if (atomicExchange(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_fs.data[gl_LocalInvocationIndex] = 1u;\n    return;\n  }\n  if (atomicExchange(g_int_fs.data[gl_LocalInvocationIndex], 1) != 0) return;\n  if (atomicAdd(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;\n  if (atomicMin(g_int_fs.data[gl_LocalInvocationIndex], 1) != 3) return;\n  if (atomicMax(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;\n  if (atomicAnd(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 2) return;\n  if (atomicOr(g_int_fs.data[gl_LocalInvocationIndex], 0x3) != 0) return;\n  if (atomicXor(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_fs.data[gl_LocalInvocationIndex], 0x2, 0x7) != 2) {\n    g_int_fs.data[gl_LocalInvocationIndex] = 1;\n    return;\n  }\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 4) in;\nlayout(std430, binding = 2) coherent buffer FSuint {\n  uint data[4];\n} g_uint_fs;\nlayout(std430, binding = 3) coherent buffer FSint {\n  int data[4];\n} g_int_fs;\nuniform uint g_uint_value[8];\nvoid main() {\n  if (atomicExchange(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 0u) return;\n  if (atomicAdd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;\n  if (atomicMin(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 3u) return;\n  if (atomicMax(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;\n  if (atomicAnd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[3]) != 2u) return;\n  if (atomicOr(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[4]) != 0u) return;\n  if (g_uint_value[0] > 0u) {\n    if (atomicXor(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[5]) != 3u) return;\n  }\n  if (atomicCompSwap(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]) != 2u) {\n    g_uint_fs.data[gl_LocalInvocationIndex] = 1u;\n    return;\n  }\n  if (atomicExchange(g_int_fs.data[gl_LocalInvocationIndex], 1) != 0) return;\n  if (atomicAdd(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;\n  if (atomicMin(g_int_fs.data[gl_LocalInvocationIndex], 1) != 3) return;\n  if (atomicMax(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;\n  if (atomicAnd(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 2) return;\n  if (atomicOr(g_int_fs.data[gl_LocalInvocationIndex], 0x3) != 0) return;\n  if (atomicXor(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 3) return;\n  if (atomicCompSwap(g_int_fs.data[gl_LocalInvocationIndex], 0x2, 0x7) != 2) {\n    g_int_fs.data[gl_LocalInvocationIndex] = 1;\n    return;\n  }\n}"
             ,&local_41);
  GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,2,this->m_storage_buffer);
    for (data[2] = 0; (uint)data[2] < 2; data[2] = data[2] + 1) {
      memset(unif + 6,0,0x10);
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,data[2] + 2,this->m_storage_buffer[(uint)data[2]]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x10,unif + 6,0x88e8);
    }
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    data_1 = (GLuint *)0x100000003;
    unif[0] = 2;
    unif[1] = 1;
    unif[2] = 3;
    unif[3] = 1;
    unif[4] = 2;
    unif[5] = 7;
    location = glu::CallLogWrapper::glGetUniformLocation
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,this->m_program,"g_uint_value[0]");
    glu::CallLogWrapper::glUniform1uiv
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,location,8,(GLuint *)&data_1);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x200);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,this->m_storage_buffer[0]);
    pvVar3 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                         super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
    if (pvVar3 == (void *)0x0) {
      this_local = (BasicAtomicCase1CS *)&DAT_ffffffffffffffff;
    }
    else {
      for (data_2._4_4_ = 0; data_2._4_4_ < 4; data_2._4_4_ = data_2._4_4_ + 1) {
        if (*(int *)((long)pvVar3 + (ulong)data_2._4_4_ * 4) != 7) {
          anon_unknown_0::Output
                    ("uData at index %d is %d should be %d.\n",(ulong)data_2._4_4_,
                     (ulong)*(uint *)((long)pvVar3 + (ulong)data_2._4_4_ * 4),7);
          return (long)&DAT_ffffffffffffffff;
        }
      }
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[1]);
      pvVar3 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
      if (pvVar3 == (void *)0x0) {
        this_local = (BasicAtomicCase1CS *)&DAT_ffffffffffffffff;
      }
      else {
        for (local_a4 = 0; (int)local_a4 < 4; local_a4 = local_a4 + 1) {
          if (*(int *)((long)pvVar3 + (long)(int)local_a4 * 4) != 7) {
            anon_unknown_0::Output
                      ("iData at index %d is %d should be %d.\n",(ulong)local_a4,
                       (ulong)*(uint *)((long)pvVar3 + (long)(int)local_a4 * 4),7);
            return (long)&DAT_ffffffffffffffff;
          }
        }
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        this_local = (BasicAtomicCase1CS *)0x0;
      }
    }
  }
  else {
    this_local = (BasicAtomicCase1CS *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(std430, binding = 2) coherent buffer FSuint {" NL
			   "  uint data[4];" NL "} g_uint_fs;" NL "layout(std430, binding = 3) coherent buffer FSint {" NL
			   "  int data[4];" NL "} g_int_fs;" NL "uniform uint g_uint_value[8];" NL "void main() {" NL
			   "  if (atomicExchange(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 0u) return;" NL
			   "  if (atomicAdd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicMin(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[1]) != 3u) return;" NL
			   "  if (atomicMax(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[2]) != 1u) return;" NL
			   "  if (atomicAnd(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[3]) != 2u) return;" NL
			   "  if (atomicOr(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[4]) != 0u) return;" NL
			   "  if (g_uint_value[0] > 0u) {" NL
			   "    if (atomicXor(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[5]) != 3u) return;" NL "  }" NL
			   "  if (atomicCompSwap(g_uint_fs.data[gl_LocalInvocationIndex], g_uint_value[6], g_uint_value[7]) != 2u) "
			   "{" NL "    g_uint_fs.data[gl_LocalInvocationIndex] = 1u;" NL "    return;" NL "  }" NL
			   "  if (atomicExchange(g_int_fs.data[gl_LocalInvocationIndex], 1) != 0) return;" NL
			   "  if (atomicAdd(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;" NL
			   "  if (atomicMin(g_int_fs.data[gl_LocalInvocationIndex], 1) != 3) return;" NL
			   "  if (atomicMax(g_int_fs.data[gl_LocalInvocationIndex], 2) != 1) return;" NL
			   "  if (atomicAnd(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 2) return;" NL
			   "  if (atomicOr(g_int_fs.data[gl_LocalInvocationIndex], 0x3) != 0) return;" NL
			   "  if (atomicXor(g_int_fs.data[gl_LocalInvocationIndex], 0x1) != 3) return;" NL
			   "  if (atomicCompSwap(g_int_fs.data[gl_LocalInvocationIndex], 0x2, 0x7) != 2) {" NL
			   "    g_int_fs.data[gl_LocalInvocationIndex] = 1;" NL "    return;" NL "  }" NL "}";
		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_storage_buffer);
		for (GLuint i = 0; i < 2; ++i)
		{
			const int data[4] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 2, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_DRAW);
		}

		glUseProgram(m_program);
		GLuint unif[8] = { 3, 1, 2, 1, 3, 1, 2, 7 };
		glUniform1uiv(glGetUniformLocation(m_program, "g_uint_value[0]"), 8, unif);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* uint data */
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
			GLuint* data = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (GLuint i = 0; i < 4; ++i)
			{
				if (data[i] != 7)
				{
					Output("uData at index %d is %d should be %d.\n", i, data[i], 7);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		/* int data */
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[1]);
			GLint* data = (GLint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 16, GL_MAP_READ_BIT);
			if (!data)
				return ERROR;
			for (GLint i = 0; i < 4; ++i)
			{
				if (data[i] != 7)
				{
					Output("iData at index %d is %d should be %d.\n", i, data[i], 7);
					return ERROR;
				}
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}
		return NO_ERROR;
	}